

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O1

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteDataBuffer *buffer)

{
  QDecompressHelper *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  bool bVar6;
  
  this->totalCompressedBytes = this->totalCompressedBytes + buffer->bufferCompleteSize;
  QByteDataBuffer::append(&this->compressedDataBuffer,buffer);
  bVar6 = countInternal(this,buffer);
  if (bVar6) {
    return;
  }
  if (((this->errorStr).d.size == 0) &&
     (pQVar1 = (this->countHelper)._M_t.
               super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
               _M_t.
               super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
               super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl,
     pQVar1 != (QDecompressHelper *)0x0)) {
    pDVar2 = (pQVar1->errorStr).d.d;
    pcVar3 = *(char16_t **)((long)&(pQVar1->errorStr).d + 8);
    qVar4 = *(qsizetype *)((long)&(pQVar1->errorStr).d + 0x10);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar5 = &((this->errorStr).d.d)->super_QArrayData;
    (this->errorStr).d.d = pDVar2;
    (this->errorStr).d.ptr = pcVar3;
    (this->errorStr).d.size = qVar4;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  clear(this);
  return;
}

Assistant:

void QDecompressHelper::feed(const QByteDataBuffer &buffer)
{
    Q_ASSERT(contentEncoding != None);
    totalCompressedBytes += buffer.byteAmount();
    compressedDataBuffer.append(buffer);
    if (!countInternal(buffer)) {
        if (errorStr.isEmpty() && countHelper)
            errorStr = countHelper->errorString();
        clear(); // If our counting brother failed then so will we :|
    }
}